

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cc
# Opt level: O2

bool __thiscall
flow::Runtime::verifyNativeCalls(Runtime *this,IRProgram *program,IRBuilder *builder)

{
  _Alloc_hider _Var1;
  long *plVar2;
  Instr *pIVar3;
  IRBuilder *sig;
  int iVar4;
  pointer puVar5;
  long lVar6;
  Signature *pSVar7;
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  *plVar8;
  IRHandler *siglen;
  _List_node_base *p_Var9;
  long *plVar10;
  uchar *in_R8;
  size_t in_R9;
  NativeCallback *native;
  Instr *instr;
  list<std::pair<flow::Instr_*,_flow::NativeCallback_*>,_std::allocator<std::pair<flow::Instr_*,_flow::NativeCallback_*>_>_>
  calls;
  NativeCallback *local_80;
  Instr *local_78;
  _List_node_base local_70;
  undefined8 local_60;
  IRBuilder *local_58;
  pointer local_50;
  pointer local_48;
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  *local_40;
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  *local_38;
  
  local_58 = builder;
  local_70._M_prev = &local_70;
  local_70._M_next = &local_70;
  local_60 = 0;
  puVar5 = (program->handlers_).
           super__Vector_base<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  siglen = (IRHandler *)
           (program->handlers_).
           super__Vector_base<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_50 = (pointer)siglen;
  while (sig = local_58, puVar5 != local_50) {
    local_40 = &((puVar5->_M_t).
                 super___uniq_ptr_impl<flow::IRHandler,_std::default_delete<flow::IRHandler>_>._M_t.
                 super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>.
                 super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl)->blocks_;
    local_48 = puVar5;
    plVar8 = local_40;
    while (siglen = ((_Head_base<0UL,_flow::IRHandler_*,_false> *)
                    &(plVar8->
                     super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                     )._M_impl._M_node.super__List_node_base._M_next)->_M_head_impl,
          siglen != (IRHandler *)local_40) {
      local_38 = (list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                  *)siglen;
      _Var1._M_p = (((string *)((long)&(siglen->super_Constant).super_Value + 0x10))->_M_dataplus).
                   _M_p;
      plVar2 = *(long **)(_Var1._M_p + 0x58);
      for (plVar10 = *(long **)(_Var1._M_p + 0x50); plVar8 = local_38, plVar10 != plVar2;
          plVar10 = plVar10 + 1) {
        pIVar3 = (Instr *)*plVar10;
        local_78 = pIVar3;
        if (pIVar3 != (Instr *)0x0) {
          lVar6 = __dynamic_cast(pIVar3,&Instr::typeinfo,&CallInstr::typeinfo,0);
          if (lVar6 == 0) {
            lVar6 = __dynamic_cast(pIVar3,&Instr::typeinfo,&HandlerCallInstr::typeinfo,0);
            if (lVar6 != 0) {
              pSVar7 = IRBuiltinHandler::signature
                                 ((IRBuiltinHandler *)**(undefined8 **)(lVar6 + 0x50));
              local_80 = find(this,pSVar7);
              if (local_80 != (NativeCallback *)0x0) {
                std::__cxx11::
                list<std::pair<flow::Instr*,flow::NativeCallback*>,std::allocator<std::pair<flow::Instr*,flow::NativeCallback*>>>
                ::emplace_back<flow::Instr*&,flow::NativeCallback*&>
                          ((list<std::pair<flow::Instr*,flow::NativeCallback*>,std::allocator<std::pair<flow::Instr*,flow::NativeCallback*>>>
                            *)&local_70,&local_78,&local_80);
              }
            }
          }
          else {
            pSVar7 = IRBuiltinFunction::signature
                               ((IRBuiltinFunction *)**(undefined8 **)(lVar6 + 0x50));
            local_80 = find(this,pSVar7);
            if (local_80 != (NativeCallback *)0x0) {
              std::__cxx11::
              list<std::pair<flow::Instr*,flow::NativeCallback*>,std::allocator<std::pair<flow::Instr*,flow::NativeCallback*>>>
              ::emplace_back<flow::Instr*&,flow::NativeCallback*&>
                        ((list<std::pair<flow::Instr*,flow::NativeCallback*>,std::allocator<std::pair<flow::Instr*,flow::NativeCallback*>>>
                          *)&local_70,&local_78,&local_80);
            }
          }
        }
      }
    }
    puVar5 = local_48 + 1;
  }
  p_Var9 = &local_70;
  do {
    p_Var9 = (((_List_impl *)&p_Var9->_M_next)->_M_node).super__List_node_base._M_next;
    if (p_Var9 == &local_70) break;
    iVar4 = NativeCallback::verify
                      ((NativeCallback *)p_Var9[1]._M_prev,(EVP_PKEY_CTX *)p_Var9[1]._M_next,
                       (uchar *)sig,(size_t)siglen,in_R8,in_R9);
  } while ((char)iVar4 != '\0');
  std::__cxx11::
  _List_base<std::pair<flow::Instr_*,_flow::NativeCallback_*>,_std::allocator<std::pair<flow::Instr_*,_flow::NativeCallback_*>_>_>
  ::_M_clear((_List_base<std::pair<flow::Instr_*,_flow::NativeCallback_*>,_std::allocator<std::pair<flow::Instr_*,_flow::NativeCallback_*>_>_>
              *)&local_70);
  return p_Var9 == &local_70;
}

Assistant:

bool Runtime::verifyNativeCalls(IRProgram* program, IRBuilder* builder) {
  std::list<std::pair<Instr*, NativeCallback*>> calls;

  for (IRHandler* handler : program->handlers()) {
    for (BasicBlock* bb : handler->basicBlocks()) {
      for (Instr* instr : bb->instructions()) {
        if (auto ci = dynamic_cast<CallInstr*>(instr)) {
          if (auto native = find(ci->callee()->signature())) {
            calls.emplace_back(instr, native);
          }
        } else if (auto hi = dynamic_cast<HandlerCallInstr*>(instr)) {
          if (auto native = find(hi->callee()->signature())) {
            calls.emplace_back(instr, native);
          }
        }
      }
    }
  }

  for (const std::pair<Instr*, NativeCallback*>& call : calls) {
    if (!call.second->verify(call.first, builder)) {
      return false;
    }
  }

  return true;
}